

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char sqlite3AffinityType(char *zIn,Column *pCol)

{
  uint uVar1;
  long in_RSI;
  byte *in_RDI;
  int v;
  int *unaff_retaddr;
  char *zChar;
  char aff;
  u32 h;
  uint local_24;
  byte *local_20;
  byte local_15;
  uint local_14;
  byte *local_8;
  
  local_14 = 0;
  local_15 = 0x43;
  local_20 = (byte *)0x0;
  local_8 = in_RDI;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  if (*local_8 == 0) goto LAB_0019eda6;
                  local_14 = local_14 * 0x100 + (uint)""[(int)(uint)*local_8];
                  local_8 = local_8 + 1;
                  if (local_14 != 0x63686172) break;
                  local_15 = 0x42;
                  local_20 = local_8;
                }
                if (local_14 != 0x636c6f62) break;
                local_15 = 0x42;
              }
              if (local_14 != 0x74657874) break;
              local_15 = 0x42;
            }
            if ((local_14 != 0x626c6f62) || ((local_15 != 0x43 && (local_15 != 0x45)))) break;
            local_15 = 0x41;
            if (*local_8 == 0x28) {
              local_20 = local_8;
            }
          }
          if ((local_14 != 0x7265616c) || (local_15 != 0x43)) break;
          local_15 = 0x45;
        }
        if ((local_14 != 0x666c6f61) || (local_15 != 0x43)) break;
        local_15 = 0x45;
      }
      if ((local_14 != 0x646f7562) || (local_15 != 0x43)) break;
      local_15 = 0x45;
    }
  } while ((local_14 & 0xffffff) != 0x696e74);
  local_15 = 0x44;
LAB_0019eda6:
  if (in_RSI != 0) {
    local_24 = 0;
    if (local_15 < 0x43) {
      if (local_20 == (byte *)0x0) {
        local_24 = 0x10;
      }
      else {
        for (; *local_20 != 0; local_20 = local_20 + 1) {
          if ((""[*local_20] & 4) != 0) {
            sqlite3GetInt32(zChar,unaff_retaddr);
            break;
          }
        }
      }
    }
    uVar1 = local_24 / 4 + 1;
    local_24._0_1_ = (undefined1)uVar1;
    if (0xff < uVar1) {
      local_24._0_1_ = 0xff;
    }
    *(undefined1 *)(in_RSI + 0x1a) = (undefined1)local_24;
  }
  return local_15;
}

Assistant:

SQLITE_PRIVATE char sqlite3AffinityType(const char *zIn, Column *pCol){
  u32 h = 0;
  char aff = SQLITE_AFF_NUMERIC;
  const char *zChar = 0;

  assert( zIn!=0 );
  while( zIn[0] ){
    h = (h<<8) + sqlite3UpperToLower[(*zIn)&0xff];
    zIn++;
    if( h==(('c'<<24)+('h'<<16)+('a'<<8)+'r') ){             /* CHAR */
      aff = SQLITE_AFF_TEXT;
      zChar = zIn;
    }else if( h==(('c'<<24)+('l'<<16)+('o'<<8)+'b') ){       /* CLOB */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('t'<<24)+('e'<<16)+('x'<<8)+'t') ){       /* TEXT */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('b'<<24)+('l'<<16)+('o'<<8)+'b')          /* BLOB */
        && (aff==SQLITE_AFF_NUMERIC || aff==SQLITE_AFF_REAL) ){
      aff = SQLITE_AFF_BLOB;
      if( zIn[0]=='(' ) zChar = zIn;
#ifndef SQLITE_OMIT_FLOATING_POINT
    }else if( h==(('r'<<24)+('e'<<16)+('a'<<8)+'l')          /* REAL */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('f'<<24)+('l'<<16)+('o'<<8)+'a')          /* FLOA */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('d'<<24)+('o'<<16)+('u'<<8)+'b')          /* DOUB */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
#endif
    }else if( (h&0x00FFFFFF)==(('i'<<16)+('n'<<8)+'t') ){    /* INT */
      aff = SQLITE_AFF_INTEGER;
      break;
    }
  }

  /* If pCol is not NULL, store an estimate of the field size.  The
  ** estimate is scaled so that the size of an integer is 1.  */
  if( pCol ){
    int v = 0;   /* default size is approx 4 bytes */
    if( aff<SQLITE_AFF_NUMERIC ){
      if( zChar ){
        while( zChar[0] ){
          if( sqlite3Isdigit(zChar[0]) ){
            /* BLOB(k), VARCHAR(k), CHAR(k) -> r=(k/4+1) */
            sqlite3GetInt32(zChar, &v);
            break;
          }
          zChar++;
        }
      }else{
        v = 16;   /* BLOB, TEXT, CLOB -> r=5  (approx 20 bytes)*/
      }
    }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( v>=sqlite3GlobalConfig.szSorterRef ){
      pCol->colFlags |= COLFLAG_SORTERREF;
    }
#endif
    v = v/4 + 1;
    if( v>255 ) v = 255;
    pCol->szEst = v;
  }
  return aff;
}